

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Quat<float> __thiscall
Imath_2_5::slerp<float>(Imath_2_5 *this,Quat<float> *q1,Quat<float> *q2,float t)

{
  float __x;
  float fVar1;
  Quat<float> QVar2;
  
  __x = angle4D<float>(q1,q2);
  fVar1 = (1.0 - t) * __x;
  if (1.1920929e-07 <= fVar1 * fVar1) {
    sinf(fVar1);
  }
  if (1.1920929e-07 <= __x * __x) {
    sinf(__x);
  }
  fVar1 = __x * t;
  if (1.1920929e-07 <= fVar1 * fVar1) {
    sinf(fVar1);
  }
  if (1.1920929e-07 <= __x * __x) {
    sinf(__x);
  }
  QVar2 = Quat<float>::normalized((Quat<float> *)this);
  return QVar2;
}

Assistant:

Quat<T>
slerp (const Quat<T> &q1, const Quat<T> &q2, T t)
{
    //
    // Spherical linear interpolation.
    // Assumes q1 and q2 are normalized and that q1 != -q2.
    //
    // This method does *not* interpolate along the shortest
    // arc between q1 and q2.  If you desire interpolation
    // along the shortest arc, and q1^q2 is negative, then
    // consider calling slerpShortestArc(), below, or flipping
    // the second quaternion explicitly.
    //
    // The implementation of squad() depends on a slerp()
    // that interpolates as is, without the automatic
    // flipping.
    //
    // Don Hatch explains the method we use here on his
    // web page, The Right Way to Calculate Stuff, at
    // http://www.plunk.org/~hatch/rightway.php
    //

    T a = angle4D (q1, q2);
    T s = 1 - t;

    Quat<T> q = sinx_over_x (s * a) / sinx_over_x (a) * s * q1 +
	        sinx_over_x (t * a) / sinx_over_x (a) * t * q2;

    return q.normalized();
}